

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O1

DdNode * Cudd_addOuterSum(DdManager *dd,DdNode *M,DdNode *r,DdNode *c)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddAddOuterSumRecur(dd,M,r,c);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addOuterSum(
  DdManager *dd,
  DdNode *M,
  DdNode *r,
  DdNode *c)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddAddOuterSumRecur(dd, M, r, c);
    } while (dd->reordered == 1);
    return(res);

}